

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

boolean drown(void)

{
  bool bVar1;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  obj *obj;
  obj **obj_00;
  int y;
  int x;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uStack_50;
  int local_3c;
  
  bVar8 = true;
  if (((u._1052_1_ & 2) != 0) && (bVar2 = is_pool(level,(int)u.ux0,(int)u.uy0), bVar2 != '\0')) {
    if ((u.uprops[0x39].extrinsic == 0 && u.uprops[0x39].intrinsic == 0) &&
       (((youmonst.data)->mflags1 & 2) == 0)) {
      if (u.usteed == (monst *)0x0) {
        if (u.uprops[0x31].intrinsic == 0) goto LAB_0025778e;
      }
      else if (((u.usteed)->data->mflags1 & 2) == 0 && u.uprops[0x31].intrinsic == 0) {
LAB_0025778e:
        if (((youmonst.data)->mflags1 & 0x600) == 0 && u.uprops[0x31].extrinsic == 0)
        goto LAB_002577b1;
      }
    }
    uVar3 = mt_random();
    bVar8 = false;
    if (uVar3 % 5 != 0) {
      return '\0';
    }
  }
LAB_002577b1:
  if ((u._1052_1_ & 2) == 0) {
    bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
    pcVar7 = "plunge";
    if (bVar2 == '\0') {
      pcVar7 = "fall";
    }
    uStack_50 = 0x2e;
    if ((((u.uprops[0x31].extrinsic == 0 && u.uprops[0x31].intrinsic == 0) &&
         (((youmonst.data)->mflags1 & 0x600) == 0)) && (((youmonst.data)->mflags1 & 2) == 0)) &&
       ((u.uprops[0x39].intrinsic == 0 && (u.uprops[0x39].extrinsic == 0)))) {
      if (u.usteed == (monst *)0x0) {
        uStack_50 = 0x21;
      }
      else if (((u.usteed)->data->mflags1 & 2) == 0) {
        uStack_50 = 0x21;
      }
    }
    pline("You %s into the water%c",pcVar7,uStack_50);
    if ((((u.uprops[0x39].extrinsic == 0 && u.uprops[0x39].intrinsic == 0) &&
         (((youmonst.data)->mflags1 & 2) == 0)) &&
        ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 2) == 0)))) &&
       (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 == '\0')) {
      if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
         (u.umonnum != u.umonster)) {
        dmgtype(youmonst.data,0x24);
      }
      pline("You sink like %s.");
    }
  }
  water_damage(invent,'\0','\0');
  if ((u.umonnum == 0x29) && (uVar3 = mt_random(), uVar3 % 3 != 0)) {
    split_mon(&youmonst,(monst *)0x0);
  }
  else if (u.umonnum == 0x10a) {
    pline("You rust!");
    iVar4 = dice(2,6);
    if (u.mhmax - iVar4 != 0 && iVar4 <= u.mhmax) {
      u.mhmax = u.mhmax - iVar4;
    }
    losehp(iVar4,"rusting away",1);
  }
  if (!bVar8) {
    return '\0';
  }
  iVar4 = number_leashed();
  if (0 < iVar4) {
    pcVar7 = "es";
    if (iVar4 == 1) {
      pcVar7 = "";
    }
    pcVar6 = "s";
    if (iVar4 != 1) {
      pcVar6 = "";
    }
    pline("The leash%s slip%s loose.",pcVar7,pcVar6);
    unleash_all();
  }
  if (u.uprops[0x31].extrinsic == 0 && u.uprops[0x31].intrinsic == 0) {
    uVar3 = (youmonst.data)->mflags1;
    if (((((uVar3 & 2) == 0) && ((uVar3 & 0x600) == 0)) &&
        ((u.uprops[0x39].intrinsic == 0 && (u.uprops[0x39].extrinsic == 0)))) &&
       ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 2) == 0)))) {
      if (((u.uprops[0xe].extrinsic != 0 || u.uprops[0xe].intrinsic != 0) ||
          ((uVar3 >> 0x19 & 1) != 0)) &&
         ((u.usleep == 0 &&
          ((((uVar3 & 0x4000000) != 0 || u.uprops[0xf].extrinsic != 0) ||
            u.uprops[0xf].intrinsic != 0 ||
           (uVar3 = mt_random(), (int)(uVar3 % 3) < (int)u.uluck + (int)u.moreluck + 2)))))) {
        pline("You attempt a teleport spell.");
        if (((level->flags).field_0x9 & 8) == 0) {
          dotele();
          bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
          if (bVar2 == '\0') {
            return '\x01';
          }
        }
        else {
          pline("The attempted teleport spell fails.");
        }
      }
      if (u.usteed != (monst *)0x0) {
        dismount_steed(0);
        bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
        if (bVar2 == '\0') {
          return '\x01';
        }
      }
      if (u.usleep != 0) {
        unmul("Suddenly you wake up!");
      }
      if ((-1 < multi) && ((u.umonnum == u.umonster || ((youmonst.data)->mmove != '\0')))) {
        iVar4 = 0x65;
        do {
          iVar4 = iVar4 + -1;
          if (iVar4 == 0) {
            uVar3 = (uint)u.ux;
            for (x = uVar3 - 1; x <= (char)uVar3 + 1; x = x + 1) {
              uVar3 = (uint)u.uy;
              for (y = uVar3 - 1; y <= (char)uVar3 + 1; y = y + 1) {
                bVar2 = goodpos(level,x,y,&youmonst,0);
                if (bVar2 != '\0') goto LAB_00257d04;
                uVar3 = (uint)(byte)u.uy;
              }
              uVar3 = (uint)(byte)u.ux;
            }
            goto LAB_00257d63;
          }
          uVar3 = mt_random();
          x = uVar3 % 3 + (int)u.ux + -1;
          uVar3 = mt_random();
          y = uVar3 % 3 + (int)u.uy + -1;
          bVar2 = goodpos(level,x,y,&youmonst,0);
        } while (bVar2 == '\0');
LAB_00257d04:
        bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
        bVar8 = true;
        if (bVar2 == '\0') {
          local_3c = inv_cnt();
          while( true ) {
            obj_00 = &invent;
            iVar4 = near_capacity();
            bVar1 = (int)(uint)(uball == (obj *)0x0) < iVar4;
            if ((iVar4 <= (int)(uint)(uball == (obj *)0x0)) || (local_3c < 1)) break;
            iVar4 = rn2(local_3c);
            obj = (obj *)0x0;
            do {
              obj_00 = &((obj *)obj_00)->nobj->nobj;
              if ((obj *)obj_00 == (obj *)0x0) {
                if (obj == (obj *)0x0) {
                  bVar1 = true;
                  goto LAB_00257d2a;
                }
                break;
              }
              if (((((obj *)obj_00)->otyp != 0x210) || ((((obj *)obj_00)->field_0x4a & 1) == 0)) &&
                 ((obj *)obj_00 != uamul)) {
                iVar5 = (int)obj_00;
                iVar9 = (int)((ulong)obj_00 >> 0x20);
                auVar15._0_4_ = -(uint)((int)uarmf == iVar5);
                auVar15._4_4_ = -(uint)((int)((ulong)uarmf >> 0x20) == iVar9);
                auVar15._8_4_ = -(uint)((int)uarmu == iVar5);
                auVar15._12_4_ = -(uint)((int)((ulong)uarmu >> 0x20) == iVar9);
                auVar17._4_4_ = auVar15._0_4_;
                auVar17._0_4_ = auVar15._4_4_;
                auVar17._8_4_ = auVar15._12_4_;
                auVar17._12_4_ = auVar15._8_4_;
                auVar14._0_4_ = -(uint)((int)uarmc == iVar5);
                auVar14._4_4_ = -(uint)((int)((ulong)uarmc >> 0x20) == iVar9);
                auVar14._8_4_ = -(uint)((int)uarmg == iVar5);
                auVar14._12_4_ = -(uint)((int)((ulong)uarmg >> 0x20) == iVar9);
                auVar16._4_4_ = auVar14._0_4_;
                auVar16._0_4_ = auVar14._4_4_;
                auVar16._8_4_ = auVar14._12_4_;
                auVar16._12_4_ = auVar14._8_4_;
                auVar17 = packssdw(auVar16 & auVar14,auVar17 & auVar15);
                auVar13._0_4_ = -(uint)((int)ublindf == iVar5);
                auVar13._4_4_ = -(uint)((int)((ulong)ublindf >> 0x20) == iVar9);
                auVar13._8_4_ = -(uint)((int)uarm == iVar5);
                auVar13._12_4_ = -(uint)((int)((ulong)uarm >> 0x20) == iVar9);
                auVar12._4_4_ = auVar13._0_4_;
                auVar12._0_4_ = auVar13._4_4_;
                auVar12._8_4_ = auVar13._12_4_;
                auVar12._12_4_ = auVar13._8_4_;
                auVar11._0_4_ = -(uint)((int)uleft == iVar5);
                auVar11._4_4_ = -(uint)((int)((ulong)uleft >> 0x20) == iVar9);
                auVar11._8_4_ = -(uint)((int)uright == iVar5);
                auVar11._12_4_ = -(uint)((int)((ulong)uright >> 0x20) == iVar9);
                auVar10._4_4_ = auVar11._0_4_;
                auVar10._0_4_ = auVar11._4_4_;
                auVar10._8_4_ = auVar11._12_4_;
                auVar10._12_4_ = auVar11._8_4_;
                auVar11 = packssdw(auVar10 & auVar11,auVar12 & auVar13);
                auVar11 = packssdw(auVar11,auVar17);
                if (((((((((auVar11 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                          (auVar11 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar11 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar11 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar11 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar11 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar11 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     -1 < auVar11[0xf]) &&
                   ((((((obj *)obj_00)->field_0x4a & 1) == 0 ||
                     (((obj *)obj_00 != uarmh && ((obj *)obj_00 != uarms)))) &&
                    (iVar5 = welded((obj *)obj_00), iVar5 == 0)))) {
                  obj = (obj *)obj_00;
                }
              }
              iVar5 = iVar4 + -1;
              bVar1 = 0 < iVar4;
              iVar4 = iVar5;
            } while ((bVar1) || (obj == (obj *)0x0));
            if (obj->owornmask != 0) {
              remove_worn_item(obj,'\0');
            }
            dropx(obj);
            local_3c = local_3c + -1;
            bVar8 = false;
          }
        }
        else {
          bVar1 = false;
        }
LAB_00257d2a:
        pline("You try to crawl out of the water.");
        if (!bVar8) {
          pline("You dump some of your gear to lose weight...");
        }
        if (!bVar1) {
          pline("Pheew!  That was close.");
          teleds(x,y,'\x01');
          return '\x01';
        }
        pline("But in vain.");
      }
LAB_00257d63:
      u._1052_1_ = u._1052_1_ | 2;
      if ((((u.umonnum != u.umonster) && (u.uprops[0x3d].intrinsic == 0)) &&
          (u.uprops[0x3d].extrinsic == 0)) && (urace.malenum == 0xe8)) {
        rehumanize();
        u._1052_1_ = u._1052_1_ & 0xfd;
        return '\x01';
      }
      pline("You drown.");
      killer_format = 0;
      if (level->locations[u.ux][u.uy].typ == '\x11') {
        killer = "pool of water";
      }
      else {
        bVar2 = on_level(&u.uz,&dungeon_topology.d_medusa_level);
        killer = "pool of water";
        if (bVar2 == '\0') {
          killer = "moat";
        }
      }
      while( true ) {
        done(4);
        bVar2 = safe_teleds('\x01');
        if (bVar2 != '\0') break;
        pline("You\'re still drowning.");
      }
      if ((u._1052_1_ & 2) != 0) {
        u._1052_1_ = u._1052_1_ & 0xfd;
        bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
        pcVar7 = "in an air bubble";
        if (bVar2 == '\0') {
          pcVar7 = "on land";
        }
        pline("You find yourself back %s.",pcVar7);
        return '\x01';
      }
      return '\x01';
    }
    if ((uVar3 & 0x600) == 0) goto LAB_00257b8d;
  }
  if (flags.verbose != '\0') {
    pline("But you aren\'t drowning.");
  }
  bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level);
  if (bVar2 == '\0') {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((pcVar7 = "Your keel hits the bottom.", u.umonnum != u.umonster &&
        (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
      pcVar7 = "You touch bottom.";
    }
    pline(pcVar7);
  }
LAB_00257b8d:
  if (uball != (obj *)0x0) {
    unplacebc();
    placebc();
  }
  vision_recalc(2);
  u._1052_1_ = u._1052_1_ | 2;
  under_water(1);
  vision_full_recalc = '\x01';
  return '\0';
}

Assistant:

boolean drown(void)
{
	boolean inpool_ok = FALSE, crawl_ok;
	int i, x, y;

	/* happily wading in the same contiguous pool */
	if (u.uinwater && is_pool(level, u.ux0, u.uy0) &&
	    (Swimming || Amphibious)) {
		/* water effects on objects every now and then */
		if (!rn2(5)) inpool_ok = TRUE;
		else return FALSE;
	}

	if (!u.uinwater) {
	    pline("You %s into the water%c",
		Is_waterlevel(&u.uz) ? "plunge" : "fall",
		Amphibious || Swimming ? '.' : '!');
	    if (!Swimming && !Is_waterlevel(&u.uz))
		    pline("You sink like %s.",
			Hallucination ? "the Titanic" : "a rock");
	}

	water_damage(invent, FALSE, FALSE);

	if (u.umonnum == PM_GREMLIN && rn2(3))
	    split_mon(&youmonst, NULL);
	else if (u.umonnum == PM_IRON_GOLEM) {
	    pline("You rust!");
	    i = dice(2,6);
	    if (u.mhmax > i) u.mhmax -= i;
	    losehp(i, "rusting away", KILLED_BY);
	}
	if (inpool_ok) return FALSE;

	if ((i = number_leashed()) > 0) {
		pline("The leash%s slip%s loose.",
			(i > 1) ? "es" : "",
			(i > 1) ? "" : "s");
		unleash_all();
	}

	if (Amphibious || Swimming) {
		if (Amphibious) {
			if (flags.verbose)
				pline("But you aren't drowning.");
			if (!Is_waterlevel(&u.uz)) {
				if (Hallucination)
					pline("Your keel hits the bottom.");
				else
					pline("You touch bottom.");
			}
		}
		if (Punished) {
			unplacebc();
			placebc();
		}
		vision_recalc(2);	/* unsee old position */
		u.uinwater = 1;
		under_water(1);
		vision_full_recalc = 1;
		return FALSE;
	}
	if ((Teleportation || can_teleport(youmonst.data)) &&
		    !u.usleep && (Teleport_control || rn2(3) < Luck+2)) {
		pline("You attempt a teleport spell.");	/* utcsri!carroll */
		if (!level->flags.noteleport) {
			dotele();
			if (!is_pool(level, u.ux,u.uy))
				return TRUE;
		} else pline("The attempted teleport spell fails.");
	}
	if (u.usteed) {
		dismount_steed(DISMOUNT_GENERIC);
		if (!is_pool(level, u.ux,u.uy))
			return TRUE;
	}
	crawl_ok = FALSE;
	x = y = 0;		/* lint suppression */
	/* if sleeping, wake up now so that we don't crawl out of water
	   while still asleep; we can't do that the same way that waking
	   due to combat is handled; note unmul() clears u.usleep */
	if (u.usleep) unmul("Suddenly you wake up!");
	/* can't crawl if unable to move (crawl_ok flag stays false) */
	if (multi < 0 || (Upolyd && !youmonst.data->mmove)) goto crawl;
	/* look around for a place to crawl to */
	for (i = 0; i < 100; i++) {
		x = rn1(3,u.ux - 1);
		y = rn1(3,u.uy - 1);
		if (goodpos(level, x, y, &youmonst, 0)) {
			crawl_ok = TRUE;
			goto crawl;
		}
	}
	/* one more scan */
	for (x = u.ux - 1; x <= u.ux + 1; x++)
		for (y = u.uy - 1; y <= u.uy + 1; y++)
			if (goodpos(level, x, y, &youmonst, 0)) {
				crawl_ok = TRUE;
				goto crawl;
			}
 crawl:
	if (crawl_ok) {
		boolean lost = FALSE;
		/* time to do some strip-tease... */
		boolean succ = Is_waterlevel(&u.uz) ? TRUE :
				emergency_disrobe(&lost);

		pline("You try to crawl out of the water.");
		if (lost)
			pline("You dump some of your gear to lose weight...");
		if (succ) {
			pline("Pheew!  That was close.");
			teleds(x,y,TRUE);
			return TRUE;
		}
		/* still too much weight */
		pline("But in vain.");
	}
	u.uinwater = 1;
	/* [ALI] Vampires return to vampiric form on drowning. */
	if (Upolyd && !Unchanging && Race_if(PM_VAMPIRE)) {
		rehumanize();
		u.uinwater = 0;
		/* should be unnecessary as spoteffects() should get called */
		/* pline("You fly up out of the water!"); */
		return TRUE;
	}
	pline("You drown.");
	killer_format = KILLED_BY_AN;
	killer = (level->locations[u.ux][u.uy].typ == POOL || Is_medusa_level(&u.uz)) ?
	    "pool of water" : "moat";
	done(DROWNING);
	/* oops, we're still alive.  better get out of the water. */
	while (!safe_teleds(TRUE)) {
		pline("You're still drowning.");
		done(DROWNING);
	}
	if (u.uinwater) {
		u.uinwater = 0;
		pline("You find yourself back %s.",
		      Is_waterlevel(&u.uz) ? "in an air bubble" : "on land");
	}
	return TRUE;
}